

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O3

bool __thiscall
QXmlStreamReaderPrivate::referenceEntity
          (QXmlStreamReaderPrivate *this,QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *hash,
          Entity *entity)

{
  qsizetype qVar1;
  char16_t *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  QEntityReference *__ptr;
  uint *__ptr_00;
  long lVar6;
  char *sourceText;
  long lVar7;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((entity->field_0x30 & 0x10) == 0) {
    qVar1 = (entity->name).d.size;
    iVar5 = ((int)(entity->value).d.size - (int)qVar1) + this->entityLength + -2;
    this->entityLength = iVar5;
    if (this->entityExpansionLimit < iVar5) {
      sourceText = "Entity expands to more characters than the entity expansion limit.";
      goto LAB_0039b2b3;
    }
    entity->field_0x30 = entity->field_0x30 | 0x10;
    pcVar2 = (entity->name).d.ptr;
    __ptr = (this->entityReferenceStack).data;
    lVar7 = (this->entityReferenceStack).tos;
    lVar6 = lVar7 + 1;
    lVar3 = (this->entityReferenceStack).cap;
    if (lVar3 <= lVar6) {
      lVar7 = lVar7 + 2;
      lVar6 = lVar3 * 2;
      if (lVar7 != lVar6 && SBORROW8(lVar7,lVar6) == lVar7 + lVar3 * -2 < 0) {
        lVar6 = lVar7;
      }
      (this->entityReferenceStack).cap = lVar6;
      __ptr = (QEntityReference *)realloc(__ptr,lVar6 * 0x18);
      (this->entityReferenceStack).data = __ptr;
      if (__ptr != (QEntityReference *)0x0) {
        lVar6 = (this->entityReferenceStack).tos + 1;
        goto LAB_0039b37b;
      }
LAB_0039b415:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
      goto LAB_0039b42a;
    }
LAB_0039b37b:
    (this->entityReferenceStack).tos = lVar6;
    __ptr[lVar6].hash = hash;
    __ptr[lVar6].name.m_size = qVar1;
    __ptr[lVar6].name.m_data = pcVar2;
    __ptr_00 = (this->putStack).data;
    lVar7 = (this->putStack).tos;
    lVar6 = lVar7 + 1;
    lVar3 = (this->putStack).cap;
    if (lVar3 <= lVar6) {
      lVar7 = lVar7 + 2;
      lVar6 = lVar3 * 2;
      if (lVar7 != lVar6 && SBORROW8(lVar7,lVar6) == lVar7 + lVar3 * -2 < 0) {
        lVar6 = lVar7;
      }
      (this->putStack).cap = lVar6;
      __ptr_00 = (uint *)realloc(__ptr_00,lVar6 << 2);
      (this->putStack).data = __ptr_00;
      if (__ptr_00 == (uint *)0x0) goto LAB_0039b415;
      lVar6 = (this->putStack).tos + 1;
    }
    (this->putStack).tos = lVar6;
    __ptr_00[lVar6] = 0x2d0000;
    bVar4 = true;
  }
  else {
    sourceText = "Self-referencing entity detected.";
LAB_0039b2b3:
    QCoreApplication::translate(&local_40,"QXmlStream",sourceText,(char *)0x0,-1);
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_40);
    this->type = Invalid;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
LAB_0039b42a:
  __stack_chk_fail();
}

Assistant:

inline bool referenceEntity(QHash<QStringView, Entity> *hash, Entity &entity)
    {
        Q_ASSERT(hash);
        if (entity.isCurrentlyReferenced) {
            raiseWellFormedError(QXmlStream::tr("Self-referencing entity detected."));
            return false;
        }
        // entityLength represents the amount of additional characters the
        // entity expands into (can be negative for e.g. &amp;). It's used to
        // avoid DoS attacks through recursive entity expansions
        entityLength += entity.value.size() - entity.name.size() - 2;
        if (entityLength > entityExpansionLimit) {
            raiseWellFormedError(QXmlStream::tr("Entity expands to more characters than the entity expansion limit."));
            return false;
        }
        entity.isCurrentlyReferenced = true;
        entityReferenceStack.push() = { hash, entity.name };
        injectToken(ENTITY_DONE);
        return true;
    }